

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

light_pcapng_t * light_pcapng_open_read(char *file_path,light_boolean read_all_interfaces)

{
  light_pcapng p_Var1;
  light_pcapng_file_info *plVar2;
  int in_ESI;
  light_pcapng in_RDI;
  uint32_t type;
  light_pcapng iter;
  light_pcapng_t *pcapng;
  void *x_ret;
  int local_34;
  light_pcapng local_30;
  undefined4 in_stack_ffffffffffffffe8;
  light_pcapng_file_info *local_8;
  
  if (in_RDI == (light_pcapng)0x0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_pcapng_open_read",0xb0);
    local_8 = (light_pcapng_file_info *)0x0;
  }
  else {
    local_8 = (light_pcapng_file_info *)calloc(1,0x20);
    p_Var1 = light_read_from_path((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    *(light_pcapng *)local_8 = p_Var1;
    local_8->file_comment_size = (size_t)*(light_pcapng *)local_8;
    plVar2 = __create_file_info(iter);
    local_8->file_comment = (char *)plVar2;
    local_8->hardware_desc = (char *)0x0;
    if (in_ESI != 0) {
      for (local_30 = *(light_pcapng *)local_8; local_30 != (light_pcapng)0x0;
          local_30 = light_next_block(local_30)) {
        local_34 = -0x21524111;
        light_get_block_info(local_30,LIGHT_INFO_TYPE,&local_34,(size_t *)0x0);
        if (local_34 == 1) {
          __append_interface_block_to_file_info(in_RDI,local_8);
        }
      }
    }
  }
  return (light_pcapng_t *)local_8;
}

Assistant:

light_pcapng_t *light_pcapng_open_read(const char* file_path, light_boolean read_all_interfaces)
{
	DCHECK_NULLP(file_path, return NULL);

	light_pcapng_t *pcapng = calloc(1, sizeof(struct _light_pcapng_t));
	pcapng->pcapng = light_read_from_path(file_path);
	pcapng->pcapng_iter = pcapng->pcapng;
	pcapng->file_info = __create_file_info(pcapng->pcapng);
	pcapng->file = NULL;

	if (read_all_interfaces)
	{
		light_pcapng iter = pcapng->pcapng;
		while (iter != NULL)
		{
			uint32_t type = LIGHT_UNKNOWN_DATA_BLOCK;
			light_get_block_info(iter, LIGHT_INFO_TYPE, &type, NULL);
			if (type == LIGHT_INTERFACE_BLOCK)
				__append_interface_block_to_file_info(iter, pcapng->file_info);
			iter = light_next_block(iter);
		}

	}

	return pcapng;
}